

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicFenceTests.cpp
# Opt level: O1

TestStatus *
vkt::synchronization::anon_unknown_0::basicMultiFenceCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkFence obj;
  deUint32 queueFamilyIndex;
  VkResult VVar1;
  int iVar2;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar3;
  long lVar4;
  VkFence fence [2];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  VkSubmitInfo submitInfo;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)6>_> ptrFence [2];
  VkFenceCreateInfo fenceInfo;
  VkCommandBufferBeginInfo info;
  long *local_178;
  long local_170;
  long local_168 [2];
  deUint64 local_158;
  deUint64 local_150;
  VkCommandBuffer local_148;
  DeviceInterface *pDStack_140;
  VkDevice local_138;
  VkAllocationCallbacks *pVStack_130;
  Move<vk::Handle<(vk::HandleType)24>_> local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  VkCommandBuffer *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  VkCommandPool local_d8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_d0;
  Move<vk::Handle<(vk::HandleType)6>_> local_b8;
  Move<vk::Handle<(vk::HandleType)6>_> local_98;
  VkFenceCreateInfo local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar3 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool(&local_128,vk,device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  DStack_d0.m_device =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  DStack_d0.m_allocator =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_d8.m_internal =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  DStack_d0.m_deviceIface =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_128,vk,device,
                    (VkCommandPool)
                    local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal);
  local_138 = local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pVStack_130 = local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_148 = (VkCommandBuffer)
              local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  pDStack_140 = local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_deviceIface;
  local_78.flags = 0;
  local_78._20_4_ = 0;
  local_78.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  local_78._4_4_ = 0;
  local_78.pNext = (void *)0x0;
  ::vk::createFence(&local_b8,vk,device,&local_78,(VkAllocationCallbacks *)0x0);
  ::vk::createFence(&local_98,vk,device,&local_78,(VkAllocationCallbacks *)0x0);
  local_158 = local_b8.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  local_150 = local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  local_48 = 4;
  uStack_40 = 0;
  local_58 = 0x2a;
  uStack_50 = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_108 = 0;
  uStack_f0 = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_e8 = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 4;
  uStack_100 = 1;
  local_f8 = &local_148;
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_148);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*cmdBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                    ,0x8a);
  endCommandBuffer(vk,local_148);
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&local_128,local_158);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                    ,0x8d);
  iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_158,0,0xffffffffffffffff);
  if (iVar2 == 0) {
    iVar2 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_158);
    if (iVar2 == 0) {
      VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&local_128,local_158);
      ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                        ,0x95);
      iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,2,&local_158,1,1000);
      if (iVar2 == 2) {
        VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&local_128,local_150);
        ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, fence[SECOND_FENCE])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                          ,0x9a);
        iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,2,&local_158,1,0xffffffffffffffff);
        local_178 = local_168;
        if (iVar2 == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,"Basic multi fence tests passed","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_178,
                     local_170 + (long)local_178);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,"vkWaitForFences should return VK_SUCCESS","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_178,
                     local_170 + (long)local_178);
        }
      }
      else {
        local_178 = local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"vkWaitForFences should return VK_TIMEOUT","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_178,
                   local_170 + (long)local_178);
      }
    }
    else {
      local_178 = local_168;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"Couldn\'t reset the fence","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_178,
                 local_170 + (long)local_178);
    }
  }
  else {
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"vkWaitForFences should return VK_SUCCESS","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_178,
               local_170 + (long)local_178);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  lVar4 = 0;
  do {
    obj.m_internal =
         *(deUint64 *)
          ((long)&local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal +
          lVar4);
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
                 ((long)&local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                         m_deviceIface + lVar4),obj);
    }
    *(undefined8 *)
     ((long)&local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device + lVar4)
         = 0;
    *(undefined8 *)
     ((long)&local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator +
     lVar4) = 0;
    *(undefined8 *)
     ((long)&local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal + lVar4
     ) = 0;
    *(undefined8 *)
     ((long)&local_98.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface +
     lVar4) = 0;
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  if (local_148 != (VkCommandBuffer)0x0) {
    local_128.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         (deUint64)local_148;
    (*pDStack_140->_vptr_DeviceInterface[0x48])(pDStack_140,local_138,pVStack_130,1);
  }
  if (local_d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_d0,local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus basicMultiFenceCase (Context& context)
{
	enum{FISRT_FENCE=0,SECOND_FENCE};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,  queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
	const VkFenceCreateInfo			fenceInfo			=
														{
															VK_STRUCTURE_TYPE_FENCE_CREATE_INFO, // VkStructureType		sType;
															DE_NULL,							 // const void*			pNext;
															0u,									 // VkFenceCreateFlags	flags;
														};
	const Move<VkFence>				ptrFence[2]			= { createFence(vk, device, &fenceInfo), createFence(vk, device, &fenceInfo) };
	const VkFence					fence[2]			= { *ptrFence[FISRT_FENCE], *ptrFence[SECOND_FENCE] };
	const VkCommandBufferBeginInfo	info				=
														{
															VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
															DE_NULL,										// const void*                              pNext;
															VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,	// VkCommandBufferUsageFlags                flags;
															DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
														};
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType			sType;
															DE_NULL,							// const void*				pNext;
															0u,									// deUint32					waitSemaphoreCount;
															DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
															(const VkPipelineStageFlags*)DE_NULL,
															1u,									// deUint32					commandBufferCount;
															&cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
															0u,									// deUint32					signalSemaphoreCount;
															DE_NULL,							// const VkSemaphore*		pSignalSemaphores;
														};


	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &info));
	endCommandBuffer(vk, *cmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE]));

	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence[FISRT_FENCE], DE_FALSE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_SUCCESS");

	if (VK_SUCCESS != vk.resetFences(device, 1u, &fence[FISRT_FENCE]))
		return tcu::TestStatus::fail("Couldn't reset the fence");

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE]));

	if (VK_TIMEOUT != vk.waitForFences(device, 2u, &fence[FISRT_FENCE], DE_TRUE, SHORT_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_TIMEOUT");

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[SECOND_FENCE]));

	if (VK_SUCCESS != vk.waitForFences(device, 2u, &fence[FISRT_FENCE], DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_SUCCESS");

	return tcu::TestStatus::pass("Basic multi fence tests passed");
}